

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O3

bool __thiscall cmSetPropertyCommand::HandleDirectoryMode(cmSetPropertyCommand *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  _Base_ptr p_Var3;
  long lVar4;
  bool bVar5;
  char *pcVar6;
  cmGlobalGenerator *this_00;
  cmLocalGenerator *pcVar7;
  cmMakefile *this_01;
  pointer value;
  string dir;
  string local_70;
  string local_50;
  
  uVar2 = (this->Names)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (uVar2 < 2) {
    this_01 = (this->super_cmCommand).Makefile;
    if (uVar2 != 0) {
      p_Var3 = (this->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      lVar4 = *(long *)(p_Var3 + 1);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,lVar4,(long)&(p_Var3[1]._M_parent)->_M_color + lVar4);
      bVar5 = cmsys::SystemTools::FileIsFullPath(local_70._M_dataplus._M_p);
      if (!bVar5) {
        pcVar6 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
        strlen(pcVar6);
        std::__cxx11::string::_M_replace
                  ((ulong)&local_70,0,(char *)local_70._M_string_length,(ulong)pcVar6);
        std::__cxx11::string::append((char *)&local_70);
        std::__cxx11::string::_M_append
                  ((char *)&local_70,
                   *(ulong *)((this->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1
                             ));
      }
      cmsys::SystemTools::CollapseFullPath(&local_50,&local_70);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
      paVar1 = &local_50.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
      pcVar7 = cmGlobalGenerator::FindLocalGenerator(this_00,&local_70);
      if (pcVar7 == (cmLocalGenerator *)0x0) {
        local_50._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,
                   "DIRECTORY scope provided but requested directory was not found. This could be because the directory argument was invalid or, it is valid but has not been processed yet."
                   ,"");
        cmCommand::SetError(&this->super_cmCommand,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar1) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        this_01 = pcVar7->Makefile;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (pcVar7 == (cmLocalGenerator *)0x0) goto LAB_002ac989;
    }
    if (this->Remove == false) {
      value = (this->PropertyValue)._M_dataplus._M_p;
    }
    else {
      value = (char *)0x0;
    }
    pcVar6 = (this->PropertyName)._M_dataplus._M_p;
    if (this->AppendMode == true) {
      std::__cxx11::string::string((string *)&local_70,pcVar6,(allocator *)&local_50);
      pcVar6 = "";
      if (value != (char *)0x0) {
        pcVar6 = value;
      }
      cmMakefile::AppendProperty(this_01,&local_70,pcVar6,this->AppendAsString);
    }
    else {
      std::__cxx11::string::string((string *)&local_70,pcVar6,(allocator *)&local_50);
      cmMakefile::SetProperty(this_01,&local_70,value);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    bVar5 = true;
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"allows at most one name for DIRECTORY scope.","");
    cmCommand::SetError(&this->super_cmCommand,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
LAB_002ac989:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool cmSetPropertyCommand::HandleDirectoryMode()
{
  if(this->Names.size() > 1)
    {
    this->SetError("allows at most one name for DIRECTORY scope.");
    return false;
    }

  // Default to the current directory.
  cmMakefile* mf = this->Makefile;

  // Lookup the directory if given.
  if(!this->Names.empty())
    {
    // Construct the directory name.  Interpret relative paths with
    // respect to the current directory.
    std::string dir = *this->Names.begin();
    if(!cmSystemTools::FileIsFullPath(dir.c_str()))
      {
      dir = this->Makefile->GetCurrentSourceDirectory();
      dir += "/";
      dir += *this->Names.begin();
      }

    // The local generators are associated with collapsed paths.
    dir = cmSystemTools::CollapseFullPath(dir);

    // Lookup the generator.
    if(cmLocalGenerator* lg =
       this->Makefile->GetGlobalGenerator()->FindLocalGenerator(dir))
      {
      // Use the makefile for the directory found.
      mf = lg->GetMakefile();
      }
    else
      {
      // Could not find the directory.
      this->SetError
        ("DIRECTORY scope provided but requested directory was not found. "
         "This could be because the directory argument was invalid or, "
         "it is valid but has not been processed yet.");
      return false;
      }
    }

  // Set or append the property.
  const char* name = this->PropertyName.c_str();
  const char *value = this->PropertyValue.c_str();
  if (this->Remove)
    {
    value = 0;
    }
  if(this->AppendMode)
    {
    mf->AppendProperty(name, value ? value : "", this->AppendAsString);
    }
  else
    {
    mf->SetProperty(name, value);
    }

  return true;
}